

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> *
cnpy::operator+=(vector<char,_std::allocator<char>_> *lhs,char *rhs)

{
  size_t __n;
  bool bVar1;
  
  __n = strlen(rhs);
  std::vector<char,_std::allocator<char>_>::reserve(lhs,__n);
  while (bVar1 = __n != 0, __n = __n - 1, bVar1) {
    std::vector<char,_std::allocator<char>_>::push_back(lhs,rhs);
    rhs = rhs + 1;
  }
  return lhs;
}

Assistant:

std::vector<char>& cnpy::operator+=(std::vector<char>& lhs, const char* rhs) {
    //write in little endian
    size_t len = strlen(rhs);
    lhs.reserve(len);
    for(size_t byte = 0; byte < len; byte++) {
        lhs.push_back(rhs[byte]);
    }
    return lhs;
}